

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  MessageGenerator *pMVar5;
  MessageGenerator *pMVar6;
  Printer *pPVar7;
  bool bVar8;
  LogMessage *other;
  Descriptor *pDVar9;
  mapped_type *pmVar10;
  FieldGenerator *pFVar11;
  Params *pPVar12;
  OneofDescriptor *extraout_RDX;
  OneofDescriptor *oneof;
  OneofDescriptor *oneof_00;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  OneofDescriptor *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar13;
  undefined8 extraout_RDX_04;
  javanano *this_01;
  int i;
  uint uVar14;
  char *pcVar15;
  int i_1;
  int j;
  long lVar16;
  int i_2;
  long lVar17;
  allocator local_c9;
  MessageGenerator *local_c8;
  Printer *local_c0;
  key_type local_b8;
  long local_98;
  key_type local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  pPVar12 = this->params_;
  local_c8 = this;
  if ((pPVar12->store_unknown_fields_ == false) &&
     ((*(int *)(this->descriptor_ + 0x78) != 0 || (*(int *)(this->descriptor_ + 0x68) != 0)))) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&vars,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_message.cc"
               ,0x71);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&vars,
                       "Extensions are only supported in NANO_RUNTIME if the \'store_unknown_fields\' generator option is \'true\'\n"
                      );
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&vars);
    pPVar12 = local_c8->params_;
  }
  pMVar5 = local_c8;
  bVar8 = Params::java_multiple_files
                    (pPVar12,(string *)**(undefined8 **)(local_c8->descriptor_ + 0x10));
  if ((bVar8) && (*(long *)(pMVar5->descriptor_ + 0x18) == 0)) {
    pcVar15 = "\n@SuppressWarnings(\"hiding\")\npublic final class $classname$ extends\n";
  }
  else {
    pcVar15 = "\npublic static final class $classname$ extends\n";
  }
  io::Printer::Print(printer,pcVar15,"classname",*(string **)pMVar5->descriptor_);
  bVar8 = local_c8->params_->parcelable_messages_;
  if (local_c8->params_->store_unknown_fields_ == true) {
    if (bVar8 == false) {
      pcVar15 = "    com.google.protobuf.nano.ExtendableMessageNano<$classname$>";
    }
    else {
      pcVar15 = "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>";
    }
    io::Printer::Print(printer,pcVar15,"classname",*(string **)local_c8->descriptor_);
  }
  else {
    if (bVar8 == false) {
      pcVar15 = "    com.google.protobuf.nano.MessageNano";
    }
    else {
      pcVar15 = "    com.google.protobuf.nano.android.ParcelableMessageNano";
    }
    io::Printer::Print(printer,pcVar15);
  }
  pMVar5 = local_c8;
  pcVar15 = " {\n";
  if (local_c8->params_->generate_clone_ != false) {
    pcVar15 = " implements java.lang.Cloneable {\n";
  }
  io::Printer::Print(printer,pcVar15);
  io::Printer::Indent(printer);
  if (pMVar5->params_->parcelable_messages_ == true) {
    io::Printer::Print(printer,
                       "\n// Used by Parcelable\n@SuppressWarnings({\"unused\"})\npublic static final android.os.Parcelable.Creator<$classname$> CREATOR =\n    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n        $classname$>($classname$.class);\n"
                       ,"classname",*(string **)local_c8->descriptor_);
  }
  lVar16 = 0;
  for (lVar17 = 0; pMVar5 = local_c8, pDVar9 = local_c8->descriptor_,
      lVar17 < *(int *)(pDVar9 + 0x78); lVar17 = lVar17 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)&vars,(FieldDescriptor *)(*(long *)(pDVar9 + 0x80) + lVar16),
               local_c8->params_);
    ExtensionGenerator::Generate((ExtensionGenerator *)&vars,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&vars);
    lVar16 = lVar16 + 0xa8;
  }
  lVar16 = 0;
  for (lVar17 = 0; pMVar6 = local_c8, lVar17 < *(int *)(pDVar9 + 0x58); lVar17 = lVar17 + 1) {
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)&vars,(EnumDescriptor *)(*(long *)(pDVar9 + 0x60) + lVar16),
               pMVar5->params_);
    EnumGenerator::Generate((EnumGenerator *)&vars,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)&vars);
    pDVar9 = pMVar5->descriptor_;
    lVar16 = lVar16 + 0x38;
  }
  lVar17 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(pDVar9 + 0x48); lVar16 = lVar16 + 1) {
    lVar3 = *(long *)(pDVar9 + 0x50);
    if ((*(char *)(*(long *)(lVar3 + 0x20 + lVar17) + 0x6b) != '\x01') ||
       (*(int *)(*(long *)(lVar3 + 0x10 + lVar17) + 0x8c) != 3)) {
      MessageGenerator((MessageGenerator *)&vars,(Descriptor *)(lVar3 + lVar17),pMVar6->params_);
      Generate((MessageGenerator *)&vars,printer);
      FieldGeneratorMap::~FieldGeneratorMap
                ((FieldGeneratorMap *)&vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      pDVar9 = pMVar6->descriptor_;
    }
    lVar17 = lVar17 + 0xa8;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_b8,"message_name",(allocator *)&local_90);
  local_c0 = printer;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_b8);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  std::__cxx11::string::~string((string *)&local_b8);
  lVar16 = 0;
  oneof = extraout_RDX;
  while (pDVar9 = local_c8->descriptor_, lVar16 < *(int *)(pDVar9 + 0x38)) {
    this_01 = (javanano *)(lVar16 * 0x30 + *(long *)(pDVar9 + 0x40));
    UnderscoresToCamelCase_abi_cxx11_(&local_b8,this_01,oneof);
    std::__cxx11::string::string((string *)&local_90,"oneof_name",&local_c9);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_90);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_b8,this_01,oneof_00);
    std::__cxx11::string::string((string *)&local_90,"oneof_capitalized_name",&local_c9);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_90);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar17 = (long)this_01 - *(long *)(*(long *)(this_01 + 0x10) + 0x40);
    SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)(lVar17 / 0x30 & 0xffffffff),(int)(lVar17 % 0x30));
    std::__cxx11::string::string((string *)&local_90,"oneof_index",&local_c9);
    local_98 = lVar16;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_90);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    uVar13 = extraout_RDX_00;
    for (lVar16 = 0; pPVar7 = local_c0, lVar16 < *(int *)(this_01 + 0x1c); lVar16 = lVar16 + 1) {
      puVar4 = *(undefined8 **)(*(long *)(this_01 + 0x20) + lVar16 * 8);
      SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)(ulong)*(uint *)(puVar4 + 7),(int)uVar13);
      std::__cxx11::string::string((string *)&local_90,"number",&local_c9);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_90);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b8);
      ToUpper(&local_b8,(string *)*puVar4);
      std::__cxx11::string::string((string *)&local_90,"cap_field_name",&local_c9);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_90);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b8);
      io::Printer::Print(local_c0,&vars,
                         "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
      uVar13 = extraout_RDX_01;
    }
    io::Printer::Print(local_c0,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(pPVar7,&vars,
                       "public int get$oneof_capitalized_name$Case() {\n  return this.$oneof_name$Case_;\n}\n"
                      );
    io::Printer::Print(pPVar7,&vars,
                       "public $message_name$ clear$oneof_capitalized_name$() {\n  this.$oneof_name$Case_ = 0;\n  this.$oneof_name$_ = null;\n  return this;\n}\n"
                      );
    oneof = extraout_RDX_02;
    lVar16 = local_98 + 1;
  }
  iVar1 = *(int *)(pDVar9 + 0x78);
  pcVar15 = 
  "\nprivate static final $classname$[] EMPTY_ARRAY = {};\npublic static $classname$[] emptyArray() {\n  return EMPTY_ARRAY;\n}\n"
  ;
  if (iVar1 == 0) {
    pcVar15 = 
    "\nprivate static volatile $classname$[] _emptyArray;\npublic static $classname$[] emptyArray() {\n  // Lazily initializes the empty array\n  if (_emptyArray == null) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (_emptyArray == null) {\n        _emptyArray = new $classname$[0];\n      }\n    }\n  }\n  return _emptyArray;\n}\n"
    ;
  }
  io::Printer::Print(local_c0,pcVar15,"classname",*(string **)pDVar9);
  iVar2 = (local_c8->field_generators_).total_bits_;
  if (0 < iVar2) {
    io::Printer::Print(local_c0,"\n");
    uVar13 = extraout_RDX_03;
    for (uVar14 = 0; (iVar2 + 0x1f) / 0x20 != uVar14; uVar14 = uVar14 + 1) {
      GetBitFieldName_abi_cxx11_(&local_b8,(javanano *)(ulong)uVar14,(int)uVar13);
      io::Printer::Print(local_c0,"private int $bit_field_name$;\n","bit_field_name",&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      uVar13 = extraout_RDX_04;
    }
  }
  this_00 = &local_c8->field_generators_;
  lVar17 = 0;
  for (lVar16 = 0; pPVar7 = local_c0, pDVar9 = local_c8->descriptor_,
      lVar16 < *(int *)(pDVar9 + 0x2c); lVar16 = lVar16 + 1) {
    io::Printer::Print(local_c0,"\n");
    PrintFieldComment(local_c0,(FieldDescriptor *)(*(long *)(local_c8->descriptor_ + 0x30) + lVar17)
                     );
    pFVar11 = FieldGeneratorMap::get
                        (this_00,(FieldDescriptor *)
                                 (*(long *)(local_c8->descriptor_ + 0x30) + lVar17));
    (*pFVar11->_vptr_FieldGenerator[4])(pFVar11,local_c0,(ulong)(iVar1 == 0));
    lVar17 = lVar17 + 0xa8;
  }
  if ((iVar1 == 0) && ((local_c8->field_generators_).saved_defaults_needed_ == true)) {
    io::Printer::Print(local_c0,
                       "\nprivate static volatile boolean _classInitialized;\n\npublic $classname$() {\n  // Lazily initializes the field defaults\n  if (!_classInitialized) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (!_classInitialized) {\n"
                       ,"classname",*(string **)pDVar9);
    io::Printer::Indent(pPVar7);
    io::Printer::Indent(pPVar7);
    io::Printer::Indent(pPVar7);
    io::Printer::Indent(pPVar7);
    lVar16 = 0;
    for (lVar17 = 0; lVar17 < *(int *)(local_c8->descriptor_ + 0x2c); lVar17 = lVar17 + 1) {
      pFVar11 = FieldGeneratorMap::get
                          (this_00,(FieldDescriptor *)
                                   (*(long *)(local_c8->descriptor_ + 0x30) + lVar16));
      (*pFVar11->_vptr_FieldGenerator[3])(pFVar11,pPVar7);
      lVar16 = lVar16 + 0xa8;
    }
    io::Printer::Outdent(pPVar7);
    io::Printer::Outdent(pPVar7);
    io::Printer::Outdent(pPVar7);
    io::Printer::Outdent(pPVar7);
    io::Printer::Print(pPVar7,"        _classInitialized = true;\n      }\n    }\n  }\n");
    if (local_c8->params_->generate_clear_ == false) goto LAB_00297a87;
  }
  else {
    io::Printer::Print(local_c0,"\npublic $classname$() {\n","classname",*(string **)pDVar9);
    if (local_c8->params_->generate_clear_ != true) {
      io::Printer::Indent(pPVar7);
      GenerateFieldInitializers(local_c8,pPVar7);
      io::Printer::Outdent(pPVar7);
      goto LAB_00297a87;
    }
  }
  io::Printer::Print(pPVar7,"  clear();\n");
LAB_00297a87:
  io::Printer::Print(pPVar7,"}\n");
  GenerateClear(local_c8,pPVar7);
  pPVar12 = local_c8->params_;
  if (pPVar12->generate_clone_ == true) {
    GenerateClone(local_c8,local_c0);
    pPVar12 = local_c8->params_;
  }
  pPVar7 = local_c0;
  if (pPVar12->generate_equals_ == true) {
    GenerateEquals(local_c8,local_c0);
    GenerateHashCode(local_c8,pPVar7);
  }
  GenerateMessageSerializationMethods(local_c8,pPVar7);
  GenerateMergeFromMethods(local_c8,pPVar7);
  GenerateParseFromMethods(local_c8,pPVar7);
  io::Printer::Outdent(pPVar7);
  io::Printer::Print(pPVar7,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  if (!params_.store_unknown_fields() &&
      (descriptor_->extension_count() != 0 || descriptor_->extension_range_count() != 0)) {
    GOOGLE_LOG(FATAL) << "Extensions are only supported in NANO_RUNTIME if the "
        "'store_unknown_fields' generator option is 'true'\n";
  }

  const string& file_name = descriptor_->file()->name();
  bool is_own_file =
    params_.java_multiple_files(file_name)
      && descriptor_->containing_type() == NULL;

  if (is_own_file) {
    // Note: constants (from enums and fields requiring stored defaults, emitted in the loop below)
    // may have the same names as constants in the nested classes. This causes Java warnings, but
    // is not fatal, so we suppress those warnings here in the top-most class declaration.
    printer->Print(
      "\n"
      "@SuppressWarnings(\"hiding\")\n"
      "public final class $classname$ extends\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "public static final class $classname$ extends\n",
      "classname", descriptor_->name());
  }
  if (params_.store_unknown_fields() && params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.store_unknown_fields()) {
    printer->Print(
      "    com.google.protobuf.nano.ExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableMessageNano");
  } else {
    printer->Print(
      "    com.google.protobuf.nano.MessageNano");
  }
  if (params_.generate_clone()) {
    printer->Print(" implements java.lang.Cloneable {\n");
  } else {
    printer->Print(" {\n");
  }
  printer->Indent();

  if (params_.parcelable_messages()) {
    printer->Print(
      "\n"
      "// Used by Parcelable\n"
      "@SuppressWarnings({\"unused\"})\n"
      "public static final android.os.Parcelable.Creator<$classname$> CREATOR =\n"
      "    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n"
      "        $classname$>($classname$.class);\n",
      "classname", descriptor_->name());
  }

  // Nested types and extensions
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_).Generate(printer);
  }

  // oneof
  map<string, string> vars;
  vars["message_name"] = descriptor_->name();
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof_desc = descriptor_->oneof_decl(i);
    vars["oneof_name"] = UnderscoresToCamelCase(oneof_desc);
    vars["oneof_capitalized_name"] =
        UnderscoresToCapitalizedCamelCase(oneof_desc);
    vars["oneof_index"] = SimpleItoa(oneof_desc->index());
    // Oneof Constants
    for (int j = 0; j < oneof_desc->field_count(); j++) {
      const FieldDescriptor* field = oneof_desc->field(j);
      vars["number"] = SimpleItoa(field->number());
      vars["cap_field_name"] = ToUpper(field->name());
      printer->Print(vars,
        "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
    }
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    printer->Print(vars,
      "public int get$oneof_capitalized_name$Case() {\n"
      "  return this.$oneof_name$Case_;\n"
      "}\n");
    // Oneof clear
    printer->Print(vars,
      "public $message_name$ clear$oneof_capitalized_name$() {\n"
      "  this.$oneof_name$Case_ = 0;\n"
      "  this.$oneof_name$_ = null;\n"
      "  return this;\n"
      "}\n");
  }

  // Lazy initialization of otherwise static final fields can help prevent the
  // class initializer from being generated. We want to prevent it because it
  // stops ProGuard from inlining any methods in this class into call sites and
  // therefore reducing the method count. However, extensions are best kept as
  // public static final fields with initializers, so with their existence we
  // won't bother with lazy initialization.
  bool lazy_init = descriptor_->extension_count() == 0;

  // Empty array
  if (lazy_init) {
    printer->Print(
      "\n"
      "private static volatile $classname$[] _emptyArray;\n"
      "public static $classname$[] emptyArray() {\n"
      "  // Lazily initializes the empty array\n"
      "  if (_emptyArray == null) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (_emptyArray == null) {\n"
      "        _emptyArray = new $classname$[0];\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return _emptyArray;\n"
      "}\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "private static final $classname$[] EMPTY_ARRAY = {};\n"
      "public static $classname$[] emptyArray() {\n"
      "  return EMPTY_ARRAY;\n"
      "}\n",
      "classname", descriptor_->name());
  }

  // Integers for bit fields
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  if (totalInts > 0) {
    printer->Print("\n");
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Fields and maybe their default values
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(
        printer, lazy_init);
  }

  // Constructor, with lazy init code if needed
  if (lazy_init && field_generators_.saved_defaults_needed()) {
    printer->Print(
      "\n"
      "private static volatile boolean _classInitialized;\n"
      "\n"
      "public $classname$() {\n"
      "  // Lazily initializes the field defaults\n"
      "  if (!_classInitialized) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (!_classInitialized) {\n",
      "classname", descriptor_->name());
    printer->Indent();
    printer->Indent();
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitSavedDefaultCode(printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "        _classInitialized = true;\n"
      "      }\n"
      "    }\n"
      "  }\n");
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    }
    printer->Print("}\n");
  } else {
    printer->Print(
      "\n"
      "public $classname$() {\n",
      "classname", descriptor_->name());
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    } else {
      printer->Indent();
      GenerateFieldInitializers(printer);
      printer->Outdent();
    }
    printer->Print("}\n");
  }

  // Other methods in this class

  GenerateClear(printer);

  if (params_.generate_clone()) {
    GenerateClone(printer);
  }

  if (params_.generate_equals()) {
    GenerateEquals(printer);
    GenerateHashCode(printer);
  }

  GenerateMessageSerializationMethods(printer);
  GenerateMergeFromMethods(printer);
  GenerateParseFromMethods(printer);

  printer->Outdent();
  printer->Print("}\n");
}